

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwttests.c
# Opt level: O0

double absmax(double *array,int N)

{
  int local_24;
  double dStack_20;
  int i;
  double max;
  int N_local;
  double *array_local;
  
  dStack_20 = 0.0;
  for (local_24 = 0; local_24 < N; local_24 = local_24 + 1) {
    if (dStack_20 <= ABS(array[local_24])) {
      dStack_20 = ABS(array[local_24]);
    }
  }
  return dStack_20;
}

Assistant:

double absmax(double *array, int N) {
	double max;
	int i;

	max = 0.0;
	for (i = 0; i < N; ++i) {
		if (fabs(array[i]) >= max) {
			max = fabs(array[i]);
		}
	}

	return max;
}